

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_detection.cpp
# Opt level: O1

float __thiscall ncnn::ObjectBox::box_union(ObjectBox *this,ObjectBox *other)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  ulong uVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  undefined4 in_EAX;
  int iVar9;
  float fVar10;
  float fVar13;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  uVar1 = this->xmin;
  uVar5 = this->ymin;
  auVar15._4_4_ = uVar5;
  auVar15._0_4_ = uVar1;
  uVar4._0_4_ = this->xmax;
  uVar4._4_4_ = this->ymax;
  uVar2 = other->xmin;
  uVar6 = other->ymin;
  auVar16._4_4_ = uVar6;
  auVar16._0_4_ = uVar2;
  uVar3 = other->xmax;
  uVar7 = other->ymax;
  auVar12._4_4_ = uVar7;
  auVar12._0_4_ = uVar3;
  auVar15._8_8_ = 0;
  auVar16._8_8_ = 0;
  auVar16 = maxps(auVar15,auVar16);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar4;
  auVar12._8_8_ = 0;
  auVar12 = minps(auVar11,auVar12);
  fVar10 = auVar12._0_4_ - auVar16._0_4_;
  fVar13 = auVar12._4_4_ - auVar16._4_4_;
  auVar8._8_4_ = 0;
  auVar8._0_8_ = (ulong)-(uint)(fVar10 < 0.0) << 0x3f;
  auVar8._12_4_ = (int)(((ulong)-(uint)(fVar13 < 0.0) << 0x3f) >> 0x20);
  iVar9 = movmskpd(in_EAX,auVar8);
  fVar14 = 0.0;
  if (iVar9 == 0) {
    fVar14 = fVar13 * fVar10;
  }
  return (((float)(undefined4)uVar4 - (float)uVar1) * ((float)uVar4._4_4_ - (float)uVar5) +
         ((float)uVar3 - (float)uVar2) * ((float)uVar7 - (float)uVar6)) - fVar14;
}

Assistant:

float ObjectBox::box_intersection(const ObjectBox &other) const
{
    float intersection_w = box_overlap(xmin, xmax, other.xmin, other.xmax);
    float intersection_h = box_overlap(ymin, ymax, other.ymin, other.ymax);
    if (intersection_w < 0 || intersection_h < 0)
        return 0;
    float area = intersection_w * intersection_h;
    return area;
}